

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O2

size_t bssl::dtls_seal_max_input_len(SSL *ssl,uint16_t epoch,size_t max_out)

{
  bool bVar1;
  DTLSWriteEpoch *pDVar2;
  size_t sVar3;
  
  pDVar2 = dtls_get_write_epoch(ssl,epoch);
  if (pDVar2 != (DTLSWriteEpoch *)0x0) {
    sVar3 = dtls_record_header_write_len(ssl,epoch);
    if ((sVar3 <= max_out && max_out - sVar3 != 0) &&
       (sVar3 = SSLAEADContext::MaxSealInputLen
                          ((pDVar2->aead)._M_t.
                           super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t
                           .super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl,
                           max_out - sVar3), sVar3 != 0)) {
      bVar1 = use_dtls13_record_header(ssl,epoch);
      return sVar3 - bVar1;
    }
  }
  return 0;
}

Assistant:

size_t dtls_seal_max_input_len(const SSL *ssl, uint16_t epoch, size_t max_out) {
  DTLSWriteEpoch *write_epoch = dtls_get_write_epoch(ssl, epoch);
  if (write_epoch == nullptr) {
    return 0;
  }
  size_t header_len = dtls_record_header_write_len(ssl, epoch);
  if (max_out <= header_len) {
    return 0;
  }
  max_out -= header_len;
  max_out = write_epoch->aead->MaxSealInputLen(max_out);
  if (max_out > 0 && use_dtls13_record_header(ssl, epoch)) {
    // Remove 1 byte for the encrypted record type.
    max_out--;
  }
  return max_out;
}